

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

void __thiscall EventDispatcherTests::Run(EventDispatcherTests *this)

{
  EventDispatcherTests *local_218;
  undefined8 local_210;
  code *local_208;
  code *local_200;
  EventDispatcherTests *local_1f8;
  undefined8 local_1f0;
  code *local_1e8;
  code *local_1e0;
  EventDispatcherTests *local_1d8;
  undefined8 local_1d0;
  code *local_1c8;
  code *local_1c0;
  EventDispatcherTests *local_1b8;
  undefined8 local_1b0;
  code *local_1a8;
  code *local_1a0;
  EventDispatcherTests *local_198;
  undefined8 local_190;
  code *local_188;
  code *local_180;
  EventDispatcherTests *local_178;
  undefined8 local_170;
  code *local_168;
  code *local_160;
  EventDispatcherTests *local_158;
  undefined8 local_150;
  code *local_148;
  code *local_140;
  EventDispatcherTests *local_138;
  undefined8 local_130;
  code *local_128;
  code *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"event dispatcher with attached handlers","");
  local_130 = 0;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:144:52)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:144:52)>
              ::_M_manager;
  local_138 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[4])
            (this,(string *)local_38);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"dispatching an event that has no related handlers is valid","");
  local_150 = 0;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:157:70)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:157:70)>
              ::_M_manager;
  local_158 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_58);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"dispatching an event that has multiple related handlers","");
  local_170 = 0;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:161:67)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:161:67)>
              ::_M_manager;
  local_178 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_78);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"the expected handlers were called","");
  local_190 = 0;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:167:45)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:167:45)>
              ::_M_manager;
  local_198 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_98);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "removing and handler and dispatching an event that had that related handlers","");
  local_1b0 = 0;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:172:88)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:172:88)>
              ::_M_manager;
  local_1b8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"the removed handler was not called","");
  local_1d0 = 0;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:180:46)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:180:46)>
              ::_M_manager;
  local_1d8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,
             "adding a handler where the handler deconstructs before the event is dispatched","");
  local_1f0 = 0;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:185:90)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:185:90)>
              ::_M_manager;
  local_1f8 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,(string *)local_f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"the handler was not called","");
  local_210 = 0;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:194:38)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/EventDispatcher.cpp:194:38)>
              ::_M_manager;
  local_218 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_118);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  return;
}

Assistant:

virtual void Run()
	{
		Given("event dispatcher with attached handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			m_eventHandler[1] = ed::EventDispatcherHandler();

			m_mockTestEvent1Handler[0] = ut11::Mock<void(TestEvent<1>)>();
			m_mockTestEvent1Handler[1] = ut11::Mock<void(TestEvent<1>)>();

			m_eventDispatcher = std::unique_ptr<ed::EventDispatcher>(new ed::EventDispatcher());
	
			m_eventHandler[0] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0])));
			m_eventHandler[1] = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[1])));
		});
		Then("dispatching an event that has no related handlers is valid", [&]()
		{
			m_eventDispatcher->dispatch(TestEvent<2>(m_expectedValue));
		});
		When("dispatching an event that has multiple related handlers", [&]()
		{
			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the expected handlers were called", [&]()
		{
			MockVerifyTimes(1, m_mockTestEvent1Handler[0])(TestEvent<1>(m_expectedValue));
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("removing and handler and dispatching an event that had that related handlers", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the removed handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
		When("adding a handler where the handler deconstructs before the event is dispatched", [&]()
		{
			m_eventHandler[0] = ed::EventDispatcherHandler();
			{ auto otherHandler = m_eventDispatcher->addHandler(std::function<void(TestEvent<1>)>(std::ref(m_mockTestEvent1Handler[0]))); }

			m_expectedValue = 5;

			m_eventDispatcher->dispatch(TestEvent<1>(m_expectedValue));
		});
		Then("the handler was not called", [&]()
		{
			MockVerifyTimes(0, m_mockTestEvent1Handler[0])(ut11::Is::Any<TestEvent<1>>());
			MockVerifyTimes(1, m_mockTestEvent1Handler[1])(TestEvent<1>(m_expectedValue));
		});
	}